

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_cell_tuv_supported(REF_GEOM ref_geom,REF_INT *nodes,REF_INT type,REF_BOOL *supported)

{
  REF_INT id;
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  REF_INT geom1;
  REF_INT geom0;
  REF_BOOL tri_supported;
  REF_INT geom2;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  *supported = 1;
  if (1 < type - 1U) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2c4,
           "ref_geom_cell_tuv_supported","type not allowed");
    return 1;
  }
  id = nodes[(ulong)(uint)type + 1];
  if (type == 2) {
    uVar2 = ref_geom_tri_supported(ref_geom,nodes,&local_38);
    if (uVar2 != 0) {
      pcVar6 = "tri support";
      uVar5 = 0x2ca;
LAB_001718c7:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
             "ref_geom_cell_tuv_supported",(ulong)uVar2,pcVar6);
      return uVar2;
    }
    if (local_38 == 0) {
      *supported = 1;
      return 0;
    }
    uVar2 = ref_geom_find(ref_geom,*nodes,2,id,&local_3c);
    if (uVar2 != 0) {
      pcVar6 = "not found";
      uVar5 = 0x2de;
      goto LAB_001718c7;
    }
    uVar2 = ref_geom_find(ref_geom,nodes[1],2,id,&local_40);
    if (uVar2 != 0) {
      pcVar6 = "not found";
      uVar5 = 0x2df;
      goto LAB_001718c7;
    }
    uVar2 = ref_geom_find(ref_geom,nodes[2],2,id,&local_34);
    if (uVar2 != 0) {
      pcVar6 = "not found";
      uVar5 = 0x2e0;
      goto LAB_001718c7;
    }
    pRVar3 = ref_geom->descr;
    if ((pRVar3[(long)local_3c * 6 + 3] == 0) && (pRVar3[(long)local_3c * 6 + 4] == 0)) {
      return 0;
    }
    lVar4 = (long)local_40;
    local_40 = local_34;
    if (pRVar3[lVar4 * 6 + 3] != 0) goto LAB_0017190e;
    iVar1 = pRVar3[lVar4 * 6 + 4];
  }
  else {
    uVar2 = ref_geom_find(ref_geom,*nodes,type,id,&local_3c);
    if (uVar2 != 0) {
      pcVar6 = "not found";
      uVar5 = 0x2d3;
      goto LAB_001718c7;
    }
    uVar2 = ref_geom_find(ref_geom,nodes[1],type,id,&local_40);
    if (uVar2 != 0) {
      pcVar6 = "not found";
      uVar5 = 0x2d4;
      goto LAB_001718c7;
    }
    pRVar3 = ref_geom->descr;
    if (pRVar3[(long)local_3c * 6 + 3] != 0) goto LAB_0017190e;
    iVar1 = pRVar3[(long)local_3c * 6 + 4];
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_0017190e:
  if ((pRVar3[(long)local_40 * 6 + 3] != 0) || (pRVar3[(long)local_40 * 6 + 4] != 0)) {
    *supported = 0;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_cell_tuv_supported(REF_GEOM ref_geom,
                                               REF_INT *nodes, REF_INT type,
                                               REF_BOOL *supported) {
  REF_INT node_per;
  REF_INT id, geom0, geom1, geom2;
  REF_BOOL tri_supported;

  *supported = REF_TRUE;

  RAS(1 <= type && type <= 2, "type not allowed");
  node_per = type + 1;
  id = nodes[node_per];

  /* protects unsupported meshlink tri */
  if (REF_GEOM_FACE == type) {
    RSS(ref_geom_tri_supported(ref_geom, nodes, &tri_supported), "tri support");
    if (!tri_supported) { /* no geom support */
      *supported = 1.0;
      return REF_SUCCESS;
    }
  }

  switch (type) {
    case REF_GEOM_EDGE:
      RSS(ref_geom_find(ref_geom, nodes[0], type, id, &geom0), "not found");
      RSS(ref_geom_find(ref_geom, nodes[1], type, id, &geom1), "not found");

      if ((0 != ref_geom_jump(ref_geom, geom0) ||
           0 != ref_geom_degen(ref_geom, geom0)) &&
          (0 != ref_geom_jump(ref_geom, geom1) ||
           0 != ref_geom_degen(ref_geom, geom1))) {
        *supported = REF_FALSE;
      }
      break;
    case REF_GEOM_FACE:
      RSS(ref_geom_find(ref_geom, nodes[0], type, id, &geom0), "not found");
      RSS(ref_geom_find(ref_geom, nodes[1], type, id, &geom1), "not found");
      RSS(ref_geom_find(ref_geom, nodes[2], type, id, &geom2), "not found");
      if ((0 != ref_geom_jump(ref_geom, geom0) ||
           0 != ref_geom_degen(ref_geom, geom0)) &&
          (0 != ref_geom_jump(ref_geom, geom1) ||
           0 != ref_geom_degen(ref_geom, geom1)) &&
          (0 != ref_geom_jump(ref_geom, geom2) ||
           0 != ref_geom_degen(ref_geom, geom2))) {
        *supported = REF_FALSE;
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "can't to geom type yet");
  }

  return REF_SUCCESS;
}